

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O1

Aig_Man_t * Saig_ManCexMinDupWithCubes(Aig_Man_t *pAig,Vec_Vec_t *vReg2Value)

{
  char *__s;
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  Aig_Man_t *p;
  size_t sVar4;
  char *__dest;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  Aig_Obj_t *p1;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  
  if (pAig->nConstrs != 0) {
    __assert_fail("pAig->nConstrs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                  ,500,"Aig_Man_t *Saig_ManCexMinDupWithCubes(Aig_Man_t *, Vec_Vec_t *)");
  }
  iVar13 = vReg2Value->nSize;
  if ((long)iVar13 < 1) {
    iVar8 = 0;
  }
  else {
    lVar11 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + *(int *)((long)vReg2Value->pArray[lVar11] + 4);
      lVar11 = lVar11 + 1;
    } while (iVar13 != lVar11);
  }
  p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5] + iVar13 + iVar8);
  __s = pAig->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar6 = pAig->vCis;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar11];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar11 = lVar11 + 1;
      pVVar6 = pAig->vCis;
    } while (lVar11 < pVVar6->nSize);
  }
  pVVar6 = pAig->vObjs;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar11];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_00500877;
        uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        uVar7 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar5 = Aig_And(p,pAVar5,p1);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      }
      lVar11 = lVar11 + 1;
      pVVar6 = pAig->vObjs;
    } while (lVar11 < pVVar6->nSize);
  }
  if (0 < vReg2Value->nSize) {
    lVar11 = 0;
    do {
      if (lVar11 != 0) {
        pvVar1 = vReg2Value->pArray[lVar11];
        pAVar5 = p->pConst1;
        if (0 < *(int *)((long)pvVar1 + 4)) {
          lVar10 = 0;
          do {
            uVar3 = *(uint *)(*(long *)((long)pvVar1 + 8) + lVar10 * 4);
            if (((int)uVar3 < 0) || (pAig->nRegs * 2 <= (int)uVar3)) {
              __assert_fail("Lit >= 0 && Lit < 2 * Aig_ManRegNum(pAig)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                            ,0x208,"Aig_Man_t *Saig_ManCexMinDupWithCubes(Aig_Man_t *, Vec_Vec_t *)"
                           );
            }
            uVar9 = (uVar3 >> 1) + pAig->nTruePos;
            if (((int)uVar9 < 0) || (pAig->vCos->nSize <= (int)uVar9)) goto LAB_00500839;
            pvVar2 = pAig->vCos->pArray[uVar9];
            if (((ulong)pvVar2 & 1) != 0) goto LAB_00500877;
            uVar7 = *(ulong *)((long)pvVar2 + 8);
            uVar12 = uVar7 & 0xfffffffffffffffe;
            if (uVar12 == 0) {
              uVar7 = 0;
            }
            else {
              uVar7 = (ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar12 + 0x28);
            }
            pAVar5 = Aig_And(p,pAVar5,(Aig_Obj_t *)(uVar3 & 1 ^ uVar7));
            lVar10 = lVar10 + 1;
          } while (lVar10 < *(int *)((long)pvVar1 + 4));
        }
        Aig_ObjCreateCo(p,pAVar5);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vReg2Value->nSize);
  }
  if (0 < pAig->nRegs) {
    iVar13 = 0;
    do {
      uVar3 = pAig->nTruePos + iVar13;
      if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) {
LAB_00500839:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar3];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_00500877:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar7 = *(ulong *)((long)pvVar1 + 8);
      uVar12 = uVar7 & 0xfffffffffffffffe;
      if (uVar12 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar12 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar5);
      iVar13 = iVar13 + 1;
    } while (iVar13 < pAig->nRegs);
  }
  Aig_ManCleanup(p);
  Aig_ManSetRegNum(p,pAig->nRegs);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCexMinDupWithCubes( Aig_Man_t * pAig, Vec_Vec_t * vReg2Value )
{
    Vec_Int_t * vLevel;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pMiter;
    int i, k, Lit;
    assert( pAig->nConstrs == 0 );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) + Vec_VecSizeSize(vReg2Value) + Vec_VecSize(vReg2Value) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create POs for cubes
    Vec_VecForEachLevelInt( vReg2Value, vLevel, i )
    {
        if ( i == 0 )
            continue;
        pMiter = Aig_ManConst1( pAigNew );
        Vec_IntForEachEntry( vLevel, Lit, k )
        {
            assert( Lit >= 0 && Lit < 2 * Aig_ManRegNum(pAig) );
            pObj = Saig_ManLi( pAig, Abc_Lit2Var(Lit) );
            pMiter = Aig_And( pAigNew, pMiter, Aig_NotCond(Aig_ObjChild0Copy(pObj), Abc_LitIsCompl(Lit)) );
        }
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // finalize
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}